

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O2

FT_Error FT_Bitmap_Copy(FT_Library library,FT_Bitmap *source,FT_Bitmap *target)

{
  FT_Memory memory;
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  unsigned_short uVar4;
  uchar uVar5;
  uchar uVar6;
  undefined4 uVar7;
  uint in_EAX;
  uchar *puVar8;
  uint uVar9;
  FT_Error FVar10;
  FT_Byte *t;
  FT_Byte *s;
  uchar *__src;
  ulong __n;
  bool bVar11;
  ulong uStack_38;
  FT_Error error;
  
  uStack_38 = (ulong)in_EAX;
  if (library == (FT_Library)0x0) {
    FVar10 = 0x21;
  }
  else if (target == (FT_Bitmap *)0x0 || source == (FT_Bitmap *)0x0) {
    FVar10 = 6;
  }
  else {
    FVar10 = 0;
    if (source != target) {
      if (source->pitch < 0) {
        bVar11 = 0 < target->pitch;
      }
      else if (source->pitch == 0) {
        bVar11 = false;
      }
      else {
        bVar11 = SUB41((uint)target->pitch >> 0x1f,0);
      }
      memory = library->memory;
      ft_mem_free(memory,target->buffer);
      target->buffer = (uchar *)0x0;
      uVar9 = source->width;
      iVar2 = source->pitch;
      uVar3 = *(undefined4 *)&source->field_0xc;
      puVar8 = source->buffer;
      uVar4 = source->num_grays;
      uVar5 = source->pixel_mode;
      uVar6 = source->palette_mode;
      uVar7 = *(undefined4 *)&source->field_0x1c;
      target->rows = source->rows;
      target->width = uVar9;
      target->pitch = iVar2;
      *(undefined4 *)&target->field_0xc = uVar3;
      target->palette = source->palette;
      target->buffer = puVar8;
      target->num_grays = uVar4;
      target->pixel_mode = uVar5;
      target->palette_mode = uVar6;
      *(undefined4 *)&target->field_0x1c = uVar7;
      if (bVar11 != false) {
        target->pitch = -target->pitch;
      }
      if (source->buffer != (uchar *)0x0) {
        uVar9 = source->pitch;
        uVar1 = -uVar9;
        if (0 < (int)uVar9) {
          uVar1 = uVar9;
        }
        __n = (ulong)uVar1;
        puVar8 = (uchar *)ft_mem_qrealloc(memory,__n,0,(ulong)target->rows,(void *)0x0,&error);
        target->buffer = puVar8;
        if (error == 0) {
          __src = source->buffer;
          if (bVar11 == false) {
            memcpy(puVar8,__src,source->rows * __n);
          }
          else {
            uVar9 = target->rows;
            puVar8 = puVar8 + (uVar9 - 1) * __n;
            while (bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
              memcpy(puVar8,__src,__n);
              __src = __src + __n;
              puVar8 = puVar8 + -__n;
            }
          }
        }
        FVar10 = error;
      }
    }
  }
  return FVar10;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Copy( FT_Library        library,
                  const FT_Bitmap  *source,
                  FT_Bitmap        *target)
  {
    FT_Memory  memory;
    FT_Error   error  = FT_Err_Ok;
    FT_Int     pitch;
    FT_Int     flip;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !source || !target )
      return FT_THROW( Invalid_Argument );

    if ( source == target )
      return FT_Err_Ok;

    flip = ( source->pitch < 0 && target->pitch > 0 ) ||
           ( source->pitch > 0 && target->pitch < 0 );

    memory = library->memory;
    FT_FREE( target->buffer );

    *target = *source;

    if ( flip )
      target->pitch = -target->pitch;

    if ( !source->buffer )
      return FT_Err_Ok;

    pitch  = source->pitch;
    if ( pitch < 0 )
      pitch = -pitch;

    FT_MEM_QALLOC_MULT( target->buffer, target->rows, pitch );

    if ( !error )
    {
      if ( flip )
      {
        /* take care of bitmap flow */
        FT_UInt   i;
        FT_Byte*  s = source->buffer;
        FT_Byte*  t = target->buffer;


        t += (FT_ULong)pitch * ( target->rows - 1 );

        for ( i = target->rows; i > 0; i-- )
        {
          FT_ARRAY_COPY( t, s, pitch );

          s += pitch;
          t -= pitch;
        }
      }
      else
        FT_MEM_COPY( target->buffer, source->buffer,
                     (FT_Long)source->rows * pitch );
    }

    return error;
  }